

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_splitter.cpp
# Opt level: O2

void duckdb_brotli::BrotliSplitBlock
               (MemoryManager *m,Command *cmds,size_t num_commands,uint8_t *data,size_t pos,
               size_t mask,BrotliEncoderParams *params,BlockSplit *literal_split,
               BlockSplit *insert_and_copy_split,BlockSplit *dist_split)

{
  int *piVar1;
  char *pcVar2;
  long *plVar3;
  uint uVar4;
  ushort uVar5;
  size_t sVar6;
  uint8_t *puVar7;
  uint32_t *puVar8;
  HistogramLiteral *tmp;
  HistogramLiteral *pHVar9;
  uint32_t *__dest;
  void *pvVar10;
  uint16_t *puVar11;
  HistogramCommand *out;
  HistogramCommand *tmp_00;
  HistogramCommand *pHVar12;
  void *pvVar13;
  ulong uVar14;
  ushort *puVar15;
  double *pdVar16;
  void *pvVar17;
  void *pvVar18;
  void *pvVar19;
  HistogramDistance *tmp_01;
  HistogramDistance *pHVar20;
  uint32_t *puVar21;
  Command *pCVar22;
  size_t sVar23;
  ulong uVar24;
  byte bVar25;
  int iVar26;
  byte *pbVar27;
  uint *puVar28;
  double *pdVar29;
  long lVar30;
  ulong uVar31;
  ulong uVar32;
  uint32_t uVar33;
  byte bVar34;
  ulong uVar35;
  size_t sVar36;
  long lVar37;
  size_t __n;
  long lVar38;
  long lVar39;
  size_t sVar40;
  long lVar41;
  void *pvVar42;
  ulong uVar43;
  ulong uVar44;
  ulong uVar45;
  long lVar46;
  bool bVar47;
  double dVar48;
  double dVar49;
  double dVar50;
  ulong local_128;
  size_t total_length;
  HistogramDistance *local_118;
  HistogramDistance *local_110;
  HistogramCommand *local_100;
  uint32_t *local_f8;
  void *local_f0;
  uint32_t *local_e8;
  uint32_t *local_e0;
  void *local_c8;
  uint32_t *local_c0;
  void *local_b8;
  HistogramPair *local_b0;
  ulong local_a8;
  long local_a0;
  ulong local_88;
  HistogramPair *local_80;
  HistogramPair *local_68;
  ulong local_60;
  long local_58;
  
  total_length = 0;
  sVar6 = num_commands;
  pCVar22 = cmds;
  while (bVar47 = sVar6 != 0, sVar6 = sVar6 - 1, bVar47) {
    total_length = total_length + pCVar22->insert_len_;
    pCVar22 = pCVar22 + 1;
  }
  if (total_length == 0) {
    local_f0 = (void *)0x0;
  }
  else {
    local_f0 = BrotliAllocate(m,total_length);
  }
  puVar8 = &cmds->copy_len_;
  lVar38 = 0;
  sVar6 = num_commands;
  while (bVar47 = sVar6 != 0, sVar6 = sVar6 - 1, bVar47) {
    uVar45 = pos & mask;
    sVar36 = (size_t)((Command *)(puVar8 + -1))->insert_len_;
    if (mask < uVar45 + sVar36) {
      __n = (mask + 1) - uVar45;
      switchD_016b45db::default((void *)((long)local_f0 + lVar38),data + uVar45,__n);
      lVar38 = lVar38 + __n;
      sVar36 = sVar36 - __n;
      uVar45 = 0;
    }
    if (sVar36 != 0) {
      switchD_016b45db::default((void *)((long)local_f0 + lVar38),data + uVar45,sVar36);
      lVar38 = lVar38 + sVar36;
    }
    pos = (ulong)(*puVar8 & 0x1ffffff) + sVar36 + uVar45;
    puVar8 = puVar8 + 4;
  }
  local_128 = 100;
  if (total_length < 0xd480) {
    local_128 = (ulong)(ushort)((ushort)total_length / 0x220 + 1);
  }
  local_58 = 3;
  if (total_length == 0) {
    literal_split->num_types = 1;
  }
  else {
    if (0x7f < total_length) {
      uVar45 = 7;
      lVar41 = local_128 * 0x410;
      pvVar10 = BrotliAllocate(m,lVar41 + 0x410);
      for (lVar38 = 0; lVar41 - lVar38 != 0; lVar38 = lVar38 + 0x410) {
        switchD_016d8eb1::default((void *)((long)pvVar10 + lVar38),0,0x408);
        *(undefined8 *)((long)pvVar10 + lVar38 + 0x408) = 0x7ff0000000000000;
      }
      for (uVar43 = 0; uVar43 != local_128; uVar43 = uVar43 + 1) {
        uVar35 = (uVar43 * total_length) / local_128;
        if (uVar43 != 0) {
          uVar45 = (ulong)(uint)((int)uVar45 * 0x41a7);
          uVar35 = uVar35 + uVar45 % (total_length / local_128);
        }
        if (total_length <= uVar35 + 0x46) {
          uVar35 = total_length - 0x47;
        }
        plVar3 = (long *)((long)pvVar10 + uVar43 * 0x410 + 0x400);
        *plVar3 = *plVar3 + 0x46;
        for (lVar38 = -0x46; lVar38 != 0; lVar38 = lVar38 + 1) {
          piVar1 = (int *)((long)pvVar10 +
                          (ulong)*(byte *)((long)local_f0 + lVar38 + uVar35 + 0x46) * 4 +
                          uVar43 * 0x410);
          *piVar1 = *piVar1 + 1;
        }
      }
      pvVar13 = (void *)(lVar41 + (long)pvVar10);
      uVar43 = (total_length * 2) / 0x46 + local_128 + 99;
      uVar45 = 7;
      for (uVar35 = 0; uVar35 < uVar43 - uVar43 % local_128; uVar35 = uVar35 + 1) {
        switchD_016d8eb1::default(pvVar13,0,0x400);
        *(undefined8 *)((long)pvVar13 + 0x408) = 0x7ff0000000000000;
        uVar45 = (ulong)(uint)((int)uVar45 * 0x41a7);
        pbVar27 = (byte *)(uVar45 % (total_length - 0x45) + (long)local_f0);
        *(undefined8 *)((long)pvVar13 + 0x400) = 0x46;
        for (lVar38 = -0x46; lVar38 != 0; lVar38 = lVar38 + 1) {
          bVar25 = *pbVar27;
          pbVar27 = pbVar27 + 1;
          piVar1 = (int *)((long)pvVar13 + (ulong)bVar25 * 4);
          *piVar1 = *piVar1 + 1;
        }
        lVar38 = (uVar35 % local_128) * 0x410;
        plVar3 = (long *)((long)pvVar10 + lVar38 + 0x400);
        *plVar3 = *plVar3 + 0x46;
        for (lVar41 = 0; lVar41 != 0x100; lVar41 = lVar41 + 1) {
          piVar1 = (int *)((long)pvVar10 + lVar41 * 4 + lVar38);
          *piVar1 = *piVar1 + *(int *)((long)pvVar13 + lVar41 * 4);
        }
      }
      pvVar13 = BrotliAllocate(m,total_length);
      iVar26 = (int)local_128;
      pdVar16 = (double *)BrotliAllocate(m,(ulong)(uint)(iVar26 << 0xb));
      pvVar42 = BrotliAllocate(m,(ulong)(uint)(iVar26 * 8));
      sVar6 = (iVar26 + 7U >> 3) * total_length;
      if (sVar6 == 0) {
        local_c8 = (void *)0x0;
      }
      else {
        local_c8 = BrotliAllocate(m,sVar6);
      }
      pvVar17 = BrotliAllocate(m,(ulong)(uint)(iVar26 * 2));
      lVar38 = 3;
      if (10 < params->quality) {
        lVar38 = 10;
      }
      local_f8 = (uint32_t *)0x0;
      for (lVar41 = 0; lVar41 != lVar38; lVar41 = lVar41 + 1) {
        if (local_128 < 2) {
          for (sVar6 = 0; total_length != sVar6; sVar6 = sVar6 + 1) {
            *(undefined1 *)((long)pvVar13 + sVar6) = 0;
          }
          local_f8 = (uint32_t *)0x1;
        }
        else {
          uVar45 = local_128 + 7 >> 3;
          switchD_016d8eb1::default(pdVar16,0,local_128 << 0xb);
          puVar28 = (uint *)((long)pvVar10 + 0x400);
          for (uVar43 = 0; local_128 != uVar43; uVar43 = uVar43 + 1) {
            uVar35 = (ulong)*puVar28;
            if (uVar35 < 0x100) {
              dVar48 = *(double *)(kBrotliLog2Table + uVar35 * 8);
            }
            else {
              dVar48 = log2((double)uVar35);
            }
            pdVar16[uVar43] = dVar48;
            puVar28 = puVar28 + 0x104;
          }
          lVar39 = local_128 * 0x7f8;
          lVar37 = 0x100;
          lVar46 = (long)pvVar10 + 0x3fc;
          while (bVar47 = lVar37 != 0, lVar37 = lVar37 + -1, bVar47) {
            pdVar29 = pdVar16;
            for (lVar30 = 0; local_128 * 0x82 - lVar30 != 0; lVar30 = lVar30 + 0x82) {
              dVar48 = *pdVar29;
              uVar4 = *(uint *)(lVar46 + lVar30 * 8);
              uVar43 = (ulong)uVar4;
              dVar49 = -2.0;
              if (uVar43 != 0) {
                if (uVar4 < 0x100) {
                  dVar49 = *(double *)(kBrotliLog2Table + uVar43 * 8);
                }
                else {
                  dVar49 = log2((double)uVar43);
                }
              }
              *(double *)((long)pdVar29 + lVar39) = dVar48 - dVar49;
              pdVar29 = pdVar29 + 1;
            }
            lVar39 = lVar39 + local_128 * -8;
            lVar46 = lVar46 + -4;
          }
          switchD_016d8eb1::default(pvVar42,0,local_128 * 8);
          switchD_016d8eb1::default(local_c8,0,uVar45 * total_length);
          for (uVar43 = 0; uVar43 != total_length; uVar43 = uVar43 + 1) {
            bVar25 = *(byte *)((long)local_f0 + uVar43);
            dVar48 = 1e+99;
            for (uVar35 = 0; local_128 != uVar35; uVar35 = uVar35 + 1) {
              dVar49 = pdVar16[bVar25 * local_128 + uVar35] +
                       *(double *)((long)pvVar42 + uVar35 * 8);
              *(double *)((long)pvVar42 + uVar35 * 8) = dVar49;
              if (dVar49 < dVar48) {
                *(char *)((long)pvVar13 + uVar43) = (char)uVar35;
                dVar48 = dVar49;
              }
            }
            dVar49 = 28.1;
            if (uVar43 < 2000) {
              dVar49 = (((double)(long)uVar43 * 0.07) / 2000.0 + 0.77) * 28.1;
            }
            for (uVar35 = 0; local_128 != uVar35; uVar35 = uVar35 + 1) {
              dVar50 = *(double *)((long)pvVar42 + uVar35 * 8) - dVar48;
              *(double *)((long)pvVar42 + uVar35 * 8) = dVar50;
              if (dVar49 <= dVar50) {
                *(double *)((long)pvVar42 + uVar35 * 8) = dVar49;
                pbVar27 = (byte *)((long)local_c8 + (uVar35 >> 3) + uVar43 * uVar45);
                *pbVar27 = *pbVar27 | '\x01' << ((byte)uVar35 & 7);
              }
            }
          }
          bVar25 = *(byte *)((long)pvVar13 + (total_length - 1));
          pvVar18 = (void *)((total_length - 2) * uVar45 + (long)local_c8);
          local_f8 = (uint32_t *)0x1;
          for (sVar6 = total_length; sVar6 != 1; sVar6 = sVar6 - 1) {
            if ((*(byte *)((long)pvVar18 + (ulong)(bVar25 >> 3)) >> (bVar25 & 7) & 1) != 0) {
              bVar34 = *(byte *)((long)pvVar13 + (sVar6 - 2));
              local_f8 = (uint32_t *)((long)local_f8 + (ulong)(bVar25 != bVar34));
              bVar25 = bVar34;
            }
            *(byte *)((long)pvVar13 + (sVar6 - 2)) = bVar25;
            pvVar18 = (void *)((long)pvVar18 - uVar45);
          }
        }
        for (uVar45 = 0; local_128 != uVar45; uVar45 = uVar45 + 1) {
          *(undefined2 *)((long)pvVar17 + uVar45 * 2) = 0x100;
        }
        uVar5 = 0;
        for (sVar6 = 0; total_length != sVar6; sVar6 = sVar6 + 1) {
          if (*(short *)((long)pvVar17 + (ulong)*(byte *)((long)pvVar13 + sVar6) * 2) == 0x100) {
            *(ushort *)((long)pvVar17 + (ulong)*(byte *)((long)pvVar13 + sVar6) * 2) = uVar5;
            uVar5 = uVar5 + 1;
          }
        }
        for (sVar6 = 0; total_length != sVar6; sVar6 = sVar6 + 1) {
          *(undefined1 *)((long)pvVar13 + sVar6) =
               *(undefined1 *)((long)pvVar17 + (ulong)*(byte *)((long)pvVar13 + sVar6) * 2);
        }
        local_128 = (ulong)uVar5;
        for (lVar46 = 0; local_128 * 0x410 - lVar46 != 0; lVar46 = lVar46 + 0x410) {
          switchD_016d8eb1::default((void *)((long)pvVar10 + lVar46),0,0x408);
          *(undefined8 *)((long)pvVar10 + lVar46 + 0x408) = 0x7ff0000000000000;
        }
        for (sVar6 = 0; total_length != sVar6; sVar6 = sVar6 + 1) {
          lVar46 = (ulong)*(byte *)((long)pvVar13 + sVar6) * 0x410;
          piVar1 = (int *)((long)pvVar10 + (ulong)*(byte *)((long)local_f0 + sVar6) * 4 + lVar46);
          *piVar1 = *piVar1 + 1;
          plVar3 = (long *)((long)pvVar10 + lVar46 + 0x400);
          *plVar3 = *plVar3 + 1;
        }
      }
      BrotliFree(m,pdVar16);
      BrotliFree(m,pvVar42);
      BrotliFree(m,local_c8);
      BrotliFree(m,pvVar17);
      BrotliFree(m,pvVar10);
      if (local_f8 == (uint32_t *)0x0) {
        lVar38 = 0x100;
        local_e8 = (uint32_t *)0x0;
      }
      else {
        local_e8 = (uint32_t *)BrotliAllocate(m,(long)local_f8 * 4);
        lVar38 = (long)local_f8 + 0x100;
        if (lVar38 == 0) {
          sVar36 = 0;
          puVar8 = (uint32_t *)0x0;
          goto LAB_01f72665;
        }
      }
      sVar36 = lVar38 << 2;
      puVar8 = (uint32_t *)BrotliAllocate(m,sVar36);
LAB_01f72665:
      uVar43 = (long)local_f8 * 0x10 + 0x3f0;
      uVar45 = uVar43 >> 6;
      if (uVar43 < 0x40) {
        local_110 = (HistogramDistance *)0x0;
        local_c0 = (uint32_t *)0x0;
      }
      else {
        local_110 = (HistogramDistance *)BrotliAllocate(m,uVar45 * 0x410);
        local_c0 = (uint32_t *)BrotliAllocate(m,uVar45 * 4);
      }
      if (local_f8 == (uint32_t *)0x0) {
        local_118 = (HistogramDistance *)0x0;
      }
      else {
        puVar21 = (uint32_t *)0x40;
        if (local_f8 < 0x40) {
          puVar21 = local_f8;
        }
        local_118 = (HistogramDistance *)BrotliAllocate(m,(long)puVar21 * 0x410);
      }
      local_68 = (HistogramPair *)BrotliAllocate(m,0xc018);
      tmp = (HistogramLiteral *)BrotliAllocate(m,0x820);
      switchD_016d8eb1::default(puVar8,0,sVar36);
      lVar38 = 0;
      sVar6 = 0;
      while (sVar23 = sVar6 + 1, sVar23 - total_length != 1) {
        puVar8[lVar38 + 0x100] = puVar8[lVar38 + 0x100] + 1;
        if ((sVar23 == total_length) ||
           (pcVar2 = (char *)((long)pvVar13 + sVar6), sVar6 = sVar23,
           *pcVar2 != *(char *)((long)pvVar13 + sVar23))) {
          lVar38 = lVar38 + 1;
          sVar6 = sVar23;
        }
      }
      uVar43 = 0;
      total_length = (size_t)local_e8;
      local_100 = (HistogramCommand *)0x0;
      uVar35 = 0;
      local_e0 = (uint32_t *)0x0;
      local_b8 = (void *)0x0;
      puVar21 = local_f8;
      local_88 = uVar45;
      while( true ) {
        uVar14 = 0x40;
        if (puVar21 < 0x40) {
          uVar14 = (ulong)puVar21;
        }
        uVar31 = (long)local_f8 - uVar43;
        if (local_f8 < uVar43 || uVar31 == 0) break;
        for (uVar44 = 0; uVar44 != uVar14; uVar44 = uVar44 + 1) {
          uVar4 = puVar8[uVar43 + uVar44 + 0x100];
          pHVar9 = (HistogramLiteral *)((long)local_118 + uVar44 * 0x410);
          switchD_016d8eb1::default(pHVar9,0,0x408);
          ((HistogramLiteral *)((long)local_118 + uVar44 * 0x410))->bit_cost_ = INFINITY;
          for (sVar6 = 1; sVar6 - uVar4 != 1; sVar6 = sVar6 + 1) {
            pHVar9->data_[*(byte *)((long)local_f0 + sVar6 + (long)local_100 + -1)] =
                 pHVar9->data_[*(byte *)((long)local_f0 + sVar6 + (long)local_100 + -1)] + 1;
            pHVar9->total_count_ = sVar6;
          }
          dVar48 = BrotliPopulationCostLiteral(pHVar9);
          pHVar9->bit_cost_ = dVar48;
          puVar8[uVar44 + 0x40] = (uint32_t)uVar44;
          puVar8[uVar44 + 0x80] = (uint32_t)uVar44;
          puVar8[uVar44] = 1;
          local_100 = (HistogramCommand *)((long)local_100 + (ulong)uVar4);
        }
        if (0x3f < uVar31) {
          uVar31 = 0x40;
        }
        sVar6 = BrotliHistogramCombineLiteral
                          ((HistogramLiteral *)local_118,tmp,puVar8,puVar8 + 0x80,puVar8 + 0x40,
                           local_68,uVar31,uVar31,0x40,0x800);
        uVar31 = (long)local_b8 + sVar6;
        if (uVar45 < uVar31) {
          uVar44 = uVar45;
          if (uVar45 == 0) {
            uVar44 = uVar31;
          }
          do {
            uVar32 = uVar44;
            uVar44 = uVar32 * 2;
          } while (uVar32 < uVar31);
          pHVar9 = (HistogramLiteral *)BrotliAllocate(m,uVar32 * 0x410);
          if (uVar45 != 0) {
            switchD_016b45db::default(pHVar9,local_110,uVar45 * 0x410);
          }
          BrotliFree(m,local_110);
          local_110 = (HistogramDistance *)pHVar9;
          uVar45 = uVar32;
        }
        uVar31 = (long)local_e0 + sVar6;
        if (local_88 < uVar31) {
          uVar44 = local_88;
          if (local_88 == 0) {
            uVar44 = uVar31;
          }
          do {
            uVar32 = uVar44;
            uVar44 = uVar32 * 2;
          } while (uVar32 < uVar31);
          __dest = (uint32_t *)BrotliAllocate(m,uVar32 * 4);
          if (local_88 != 0) {
            switchD_016b45db::default(__dest,local_c0,local_88 << 2);
          }
          BrotliFree(m,local_c0);
          local_c0 = __dest;
          local_88 = uVar32;
        }
        pHVar9 = (HistogramLiteral *)((long)local_110 + local_b8 * 0x410);
        for (sVar23 = 0; sVar6 != sVar23; sVar23 = sVar23 + 1) {
          switchD_016b45db::default
                    (pHVar9,(HistogramLiteral *)
                            ((long)local_118 + (ulong)puVar8[sVar23 + 0x40] * 0x410),0x410);
          local_c0[(long)local_e0 + sVar23] = puVar8[puVar8[sVar23 + 0x40]];
          puVar8[(ulong)puVar8[sVar23 + 0x40] + 0xc0] = (uint32_t)sVar23;
          pHVar9 = pHVar9 + 1;
        }
        local_e0 = (uint32_t *)((long)local_e0 + sVar23);
        local_b8 = (void *)((long)local_b8 + sVar23);
        for (uVar31 = 0; uVar14 != uVar31; uVar31 = uVar31 + 1) {
          *(uint32_t *)(total_length + uVar31 * 4) =
               puVar8[(ulong)puVar8[uVar31 + 0x80] + 0xc0] + (int)uVar35;
        }
        uVar35 = uVar35 + sVar6;
        uVar43 = uVar43 + 0x40;
        puVar21 = (uint32_t *)((long)puVar21 - 0x40);
        total_length = total_length + 0x100;
      }
      BrotliFree(m,local_118);
      uVar45 = (uVar35 >> 1) * uVar35;
      if (uVar35 << 6 < uVar45) {
        uVar45 = uVar35 << 6;
      }
      if (0x800 < uVar45) {
        BrotliFree(m,local_68);
        local_68 = (HistogramPair *)BrotliAllocate(m,uVar45 * 0x18 + 0x18);
      }
      if (uVar35 == 0) {
        puVar21 = (uint32_t *)0x0;
      }
      else {
        puVar21 = (uint32_t *)BrotliAllocate(m,uVar35 * 4);
      }
      for (uVar43 = 0; uVar35 != uVar43; uVar43 = uVar43 + 1) {
        puVar21[uVar43] = (uint32_t)uVar43;
      }
      sVar6 = BrotliHistogramCombineLiteral
                        ((HistogramLiteral *)local_110,tmp,local_c0,local_e8,puVar21,local_68,uVar35
                         ,(size_t)local_f8,0x100,uVar45);
      BrotliFree(m,local_68);
      BrotliFree(m,local_c0);
      if (uVar35 == 0) {
        pvVar10 = (void *)0x0;
      }
      else {
        pvVar10 = BrotliAllocate(m,uVar35 * 4);
      }
      for (uVar45 = 0; uVar35 != uVar45; uVar45 = uVar45 + 1) {
        *(undefined4 *)((long)pvVar10 + uVar45 * 4) = 0xffffffff;
      }
      local_128 = 0;
      total_length = 0;
      for (uVar45 = 0; (uint32_t *)uVar45 != local_f8; uVar45 = uVar45 + 1) {
        switchD_016d8eb1::default(tmp,0,0x408);
        tmp->bit_cost_ = INFINITY;
        uVar43 = 0;
        while (uVar43 < puVar8[uVar45 + 0x100]) {
          tmp->data_[*(byte *)((long)local_f0 + uVar43 + local_128)] =
               tmp->data_[*(byte *)((long)local_f0 + uVar43 + local_128)] + 1;
          uVar43 = uVar43 + 1;
          tmp->total_count_ = uVar43;
        }
        lVar38 = uVar45 - 1;
        if (uVar45 == 0) {
          lVar38 = 0;
        }
        uVar35 = (ulong)local_e8[lVar38];
        local_118 = (HistogramDistance *)
                    BrotliHistogramBitCostDistanceLiteral
                              (tmp,(HistogramLiteral *)((long)local_110 + uVar35 * 0x410),tmp + 1);
        local_128 = local_128 + uVar43;
        for (sVar23 = 0; sVar6 != sVar23; sVar23 = sVar23 + 1) {
          dVar48 = BrotliHistogramBitCostDistanceLiteral
                             (tmp,(HistogramLiteral *)
                                  ((long)local_110 + (ulong)puVar21[sVar23] * 0x410),tmp + 1);
          if (dVar48 < (double)local_118) {
            uVar35 = (ulong)puVar21[sVar23];
            local_118 = (HistogramDistance *)dVar48;
          }
        }
        local_e8[uVar45] = (uint32_t)uVar35;
        if (*(int *)((long)pvVar10 + uVar35 * 4) == -1) {
          *(int *)((long)pvVar10 + uVar35 * 4) = (int)total_length;
          total_length = (size_t)((int)total_length + 1);
        }
      }
      BrotliFree(m,tmp);
      BrotliFree(m,puVar21);
      BrotliFree(m,local_110);
      puVar21 = (uint32_t *)literal_split->types_alloc_size;
      if (puVar21 < local_f8) {
        if (puVar21 == (uint32_t *)0x0) {
          puVar21 = local_f8;
        }
        do {
          uVar45 = (ulong)puVar21;
          puVar21 = (uint32_t *)(uVar45 * 2);
        } while (uVar45 < local_f8);
        puVar7 = (uint8_t *)BrotliAllocate(m,uVar45);
        if (literal_split->types_alloc_size != 0) {
          switchD_016b45db::default(puVar7,literal_split->types,literal_split->types_alloc_size);
        }
        BrotliFree(m,literal_split->types);
        literal_split->types = puVar7;
        literal_split->types_alloc_size = uVar45;
      }
      puVar21 = (uint32_t *)literal_split->lengths_alloc_size;
      if (puVar21 < local_f8) {
        if (puVar21 == (uint32_t *)0x0) {
          puVar21 = local_f8;
        }
        do {
          uVar45 = (ulong)puVar21;
          puVar21 = (uint32_t *)(uVar45 * 2);
        } while (uVar45 < local_f8);
        puVar21 = (uint32_t *)BrotliAllocate(m,uVar45 * 4);
        if (literal_split->lengths_alloc_size != 0) {
          switchD_016b45db::default
                    (puVar21,literal_split->lengths,literal_split->lengths_alloc_size << 2);
        }
        BrotliFree(m,literal_split->lengths);
        literal_split->lengths = puVar21;
        literal_split->lengths_alloc_size = uVar45;
      }
      uVar43 = 0;
      sVar6 = 0;
      uVar45 = 0;
      do {
        uVar33 = 0;
        do {
          uVar14 = uVar43;
          uVar35 = uVar45 & 0xff;
          if (local_f8 == (uint32_t *)uVar14) {
            literal_split->num_blocks = sVar6;
            literal_split->num_types = uVar35 + 1;
            BrotliFree(m,pvVar10);
            BrotliFree(m,puVar8);
            BrotliFree(m,local_e8);
            BrotliFree(m,pvVar13);
            goto LAB_01f72f7d;
          }
          uVar33 = uVar33 + puVar8[uVar14 + 0x100];
        } while (((long)local_f8 - 1U != uVar14) &&
                (uVar43 = uVar14 + 1, local_e8[uVar14] == local_e8[uVar14 + 1]));
        uVar4 = *(uint *)((long)pvVar10 + (ulong)local_e8[uVar14] * 4);
        bVar25 = (byte)uVar4;
        literal_split->types[sVar6] = bVar25;
        bVar34 = (byte)uVar45;
        uVar45 = (ulong)uVar4;
        if (bVar25 < bVar34) {
          uVar45 = uVar35;
        }
        literal_split->lengths[sVar6] = uVar33;
        sVar6 = sVar6 + 1;
        uVar43 = uVar14 + 1;
      } while( true );
    }
    sVar6 = literal_split->num_blocks;
    uVar43 = literal_split->types_alloc_size;
    uVar45 = sVar6 + 1;
    if (uVar43 < uVar45) {
      if (uVar43 == 0) {
        uVar43 = uVar45;
      }
      do {
        uVar35 = uVar43;
        uVar43 = uVar35 * 2;
      } while (uVar35 < uVar45);
      puVar7 = (uint8_t *)BrotliAllocate(m,uVar35);
      if (literal_split->types_alloc_size != 0) {
        switchD_016b45db::default(puVar7,literal_split->types,literal_split->types_alloc_size);
      }
      BrotliFree(m,literal_split->types);
      literal_split->types = puVar7;
      literal_split->types_alloc_size = uVar35;
      sVar6 = literal_split->num_blocks;
      uVar45 = sVar6 + 1;
    }
    uVar43 = literal_split->lengths_alloc_size;
    if (uVar43 < uVar45) {
      if (uVar43 == 0) {
        uVar43 = uVar45;
      }
      do {
        uVar35 = uVar43;
        uVar43 = uVar35 * 2;
      } while (uVar35 < uVar45);
      puVar8 = (uint32_t *)BrotliAllocate(m,uVar35 * 4);
      if (literal_split->lengths_alloc_size != 0) {
        switchD_016b45db::default
                  (puVar8,literal_split->lengths,literal_split->lengths_alloc_size << 2);
      }
      BrotliFree(m,literal_split->lengths);
      literal_split->lengths = puVar8;
      literal_split->lengths_alloc_size = uVar35;
      sVar6 = literal_split->num_blocks;
    }
    literal_split->num_types = 1;
    literal_split->types[sVar6] = '\0';
    sVar6 = literal_split->num_blocks;
    literal_split->lengths[sVar6] = (uint32_t)total_length;
    literal_split->num_blocks = sVar6 + 1;
  }
LAB_01f72f7d:
  BrotliFree(m,local_f0);
  if (num_commands == 0) {
    pvVar10 = (void *)0x0;
  }
  else {
    pvVar10 = BrotliAllocate(m,num_commands * 2);
  }
  puVar11 = &cmds->cmd_prefix_;
  for (sVar6 = 0; num_commands != sVar6; sVar6 = sVar6 + 1) {
    *(uint16_t *)((long)pvVar10 + sVar6 * 2) = *puVar11;
    puVar11 = puVar11 + 8;
  }
  local_128 = (ulong)(ushort)((ushort)num_commands / 0x212 + 1);
  if (0x6783 < num_commands) {
    local_128 = 0x32;
  }
  if (num_commands == 0) {
    insert_and_copy_split->num_types = 1;
  }
  else {
    if (0x7f < num_commands) {
      lVar41 = local_128 * 0xb10;
      pvVar13 = BrotliAllocate(m,lVar41 + 0xb10);
      for (lVar38 = 0; lVar41 - lVar38 != 0; lVar38 = lVar38 + 0xb10) {
        switchD_016d8eb1::default((void *)((long)pvVar13 + lVar38),0,0xb08);
        *(undefined8 *)((long)pvVar13 + lVar38 + 0xb08) = 0x7ff0000000000000;
      }
      uVar45 = 7;
      for (uVar43 = 0; uVar43 != local_128; uVar43 = uVar43 + 1) {
        uVar35 = (uVar43 * num_commands) / local_128;
        if (uVar43 != 0) {
          uVar45 = (ulong)(uint)((int)uVar45 * 0x41a7);
          uVar35 = uVar35 + uVar45 % (num_commands / local_128);
        }
        if (num_commands <= uVar35 + 0x28) {
          uVar35 = num_commands - 0x29;
        }
        plVar3 = (long *)((long)pvVar13 + uVar43 * 0xb10 + 0xb00);
        *plVar3 = *plVar3 + 0x28;
        for (lVar38 = 0; lVar38 != 0x28; lVar38 = lVar38 + 1) {
          piVar1 = (int *)((long)pvVar13 +
                          (ulong)*(ushort *)((long)pvVar10 + lVar38 * 2 + uVar35 * 2) * 4 +
                          uVar43 * 0xb10);
          *piVar1 = *piVar1 + 1;
        }
      }
      pvVar42 = (void *)(lVar41 + (long)pvVar13);
      uVar43 = (num_commands * 2) / 0x28 + local_128 + 99;
      uVar45 = 7;
      for (uVar35 = 0; uVar35 < uVar43 - uVar43 % local_128; uVar35 = uVar35 + 1) {
        switchD_016d8eb1::default(pvVar42,0,0xb00);
        *(undefined8 *)((long)pvVar42 + 0xb08) = 0x7ff0000000000000;
        uVar45 = (ulong)(uint)((int)uVar45 * 0x41a7);
        puVar15 = (ushort *)((long)pvVar10 + (uVar45 % (num_commands - 0x27)) * 2);
        *(undefined8 *)((long)pvVar42 + 0xb00) = 0x28;
        for (lVar38 = -0x28; lVar38 != 0; lVar38 = lVar38 + 1) {
          uVar5 = *puVar15;
          puVar15 = puVar15 + 1;
          piVar1 = (int *)((long)pvVar42 + (ulong)uVar5 * 4);
          *piVar1 = *piVar1 + 1;
        }
        lVar38 = (uVar35 % local_128) * 0xb10;
        plVar3 = (long *)((long)pvVar13 + lVar38 + 0xb00);
        *plVar3 = *plVar3 + 0x28;
        for (lVar41 = 0; lVar41 != 0x2c0; lVar41 = lVar41 + 1) {
          piVar1 = (int *)((long)pvVar13 + lVar41 * 4 + lVar38);
          *piVar1 = *piVar1 + *(int *)((long)pvVar42 + lVar41 * 4);
        }
      }
      pvVar42 = BrotliAllocate(m,num_commands);
      iVar26 = (int)local_128;
      pdVar16 = (double *)BrotliAllocate(m,local_128 * 0x1600);
      pvVar17 = BrotliAllocate(m,(ulong)(uint)(iVar26 * 8));
      sVar6 = (iVar26 + 7U >> 3) * num_commands;
      if (sVar6 == 0) {
        local_b8 = (void *)0x0;
      }
      else {
        local_b8 = BrotliAllocate(m,sVar6);
      }
      pvVar18 = BrotliAllocate(m,(ulong)(uint)(iVar26 * 2));
      lVar38 = 3;
      if (10 < params->quality) {
        lVar38 = 10;
      }
      total_length = 0;
      for (lVar41 = 0; lVar41 != lVar38; lVar41 = lVar41 + 1) {
        if (local_128 < 2) {
          for (sVar6 = 0; num_commands != sVar6; sVar6 = sVar6 + 1) {
            *(undefined1 *)((long)pvVar42 + sVar6) = 0;
          }
          total_length = 1;
        }
        else {
          uVar45 = local_128 + 7 >> 3;
          switchD_016d8eb1::default(pdVar16,0,local_128 * 0x1600);
          puVar28 = (uint *)((long)pvVar13 + 0xb00);
          for (uVar43 = 0; local_128 != uVar43; uVar43 = uVar43 + 1) {
            uVar35 = (ulong)*puVar28;
            if (uVar35 < 0x100) {
              dVar48 = *(double *)(kBrotliLog2Table + uVar35 * 8);
            }
            else {
              dVar48 = log2((double)uVar35);
            }
            pdVar16[uVar43] = dVar48;
            puVar28 = puVar28 + 0x2c4;
          }
          lVar39 = local_128 * 0x15f8;
          lVar37 = 0x2c0;
          lVar46 = (long)pvVar13 + 0xafc;
          while (bVar47 = lVar37 != 0, lVar37 = lVar37 + -1, bVar47) {
            pdVar29 = pdVar16;
            for (lVar30 = 0; local_128 * 0x162 - lVar30 != 0; lVar30 = lVar30 + 0x162) {
              dVar48 = *pdVar29;
              uVar4 = *(uint *)(lVar46 + lVar30 * 8);
              uVar43 = (ulong)uVar4;
              dVar49 = -2.0;
              if (uVar43 != 0) {
                if (uVar4 < 0x100) {
                  dVar49 = *(double *)(kBrotliLog2Table + uVar43 * 8);
                }
                else {
                  dVar49 = log2((double)uVar43);
                }
              }
              *(double *)((long)pdVar29 + lVar39) = dVar48 - dVar49;
              pdVar29 = pdVar29 + 1;
            }
            lVar39 = lVar39 + local_128 * -8;
            lVar46 = lVar46 + -4;
          }
          switchD_016d8eb1::default(pvVar17,0,local_128 * 8);
          switchD_016d8eb1::default(local_b8,0,uVar45 * num_commands);
          for (uVar43 = 0; uVar43 != num_commands; uVar43 = uVar43 + 1) {
            uVar5 = *(ushort *)((long)pvVar10 + uVar43 * 2);
            dVar48 = 1e+99;
            for (uVar35 = 0; local_128 != uVar35; uVar35 = uVar35 + 1) {
              dVar49 = pdVar16[uVar5 * local_128 + uVar35] + *(double *)((long)pvVar17 + uVar35 * 8)
              ;
              *(double *)((long)pvVar17 + uVar35 * 8) = dVar49;
              if (dVar49 < dVar48) {
                *(char *)((long)pvVar42 + uVar43) = (char)uVar35;
                dVar48 = dVar49;
              }
            }
            dVar49 = 13.5;
            if (uVar43 < 2000) {
              dVar49 = (((double)(long)uVar43 * 0.07) / 2000.0 + 0.77) * 13.5;
            }
            for (uVar35 = 0; local_128 != uVar35; uVar35 = uVar35 + 1) {
              dVar50 = *(double *)((long)pvVar17 + uVar35 * 8) - dVar48;
              *(double *)((long)pvVar17 + uVar35 * 8) = dVar50;
              if (dVar49 <= dVar50) {
                *(double *)((long)pvVar17 + uVar35 * 8) = dVar49;
                pbVar27 = (byte *)((long)local_b8 + (uVar35 >> 3) + uVar43 * uVar45);
                *pbVar27 = *pbVar27 | '\x01' << ((byte)uVar35 & 7);
              }
            }
          }
          bVar25 = *(byte *)((long)pvVar42 + (num_commands - 1));
          pvVar19 = (void *)((num_commands - 2) * uVar45 + (long)local_b8);
          total_length = 1;
          for (sVar6 = num_commands; sVar6 != 1; sVar6 = sVar6 - 1) {
            if ((*(byte *)((long)pvVar19 + (ulong)(bVar25 >> 3)) >> (bVar25 & 7) & 1) != 0) {
              bVar34 = *(byte *)((long)pvVar42 + (sVar6 - 2));
              total_length = total_length + (bVar25 != bVar34);
              bVar25 = bVar34;
            }
            *(byte *)((long)pvVar42 + (sVar6 - 2)) = bVar25;
            pvVar19 = (void *)((long)pvVar19 - uVar45);
          }
        }
        for (uVar45 = 0; local_128 != uVar45; uVar45 = uVar45 + 1) {
          *(undefined2 *)((long)pvVar18 + uVar45 * 2) = 0x100;
        }
        uVar5 = 0;
        for (sVar6 = 0; num_commands != sVar6; sVar6 = sVar6 + 1) {
          if (*(short *)((long)pvVar18 + (ulong)*(byte *)((long)pvVar42 + sVar6) * 2) == 0x100) {
            *(ushort *)((long)pvVar18 + (ulong)*(byte *)((long)pvVar42 + sVar6) * 2) = uVar5;
            uVar5 = uVar5 + 1;
          }
        }
        for (sVar6 = 0; num_commands != sVar6; sVar6 = sVar6 + 1) {
          *(undefined1 *)((long)pvVar42 + sVar6) =
               *(undefined1 *)((long)pvVar18 + (ulong)*(byte *)((long)pvVar42 + sVar6) * 2);
        }
        local_128 = (ulong)uVar5;
        for (lVar46 = 0; local_128 * 0xb10 - lVar46 != 0; lVar46 = lVar46 + 0xb10) {
          switchD_016d8eb1::default((void *)(lVar46 + (long)pvVar13),0,0xb08);
          *(undefined8 *)((long)pvVar13 + lVar46 + 0xb08) = 0x7ff0000000000000;
        }
        for (sVar6 = 0; num_commands != sVar6; sVar6 = sVar6 + 1) {
          lVar46 = (ulong)*(byte *)((long)pvVar42 + sVar6) * 0xb10;
          piVar1 = (int *)((long)pvVar13 +
                          (ulong)*(ushort *)((long)pvVar10 + sVar6 * 2) * 4 + lVar46);
          *piVar1 = *piVar1 + 1;
          plVar3 = (long *)((long)pvVar13 + lVar46 + 0xb00);
          *plVar3 = *plVar3 + 1;
        }
      }
      BrotliFree(m,pdVar16);
      BrotliFree(m,pvVar17);
      BrotliFree(m,local_b8);
      BrotliFree(m,pvVar18);
      BrotliFree(m,pvVar13);
      if (total_length == 0) {
        lVar38 = 0x100;
        local_e0 = (uint32_t *)0x0;
      }
      else {
        local_e0 = (uint32_t *)BrotliAllocate(m,total_length * 4);
        lVar38 = total_length + 0x100;
        if (lVar38 == 0) {
          sVar36 = 0;
          puVar8 = (uint32_t *)0x0;
          goto LAB_01f7387b;
        }
      }
      sVar36 = lVar38 << 2;
      puVar8 = (uint32_t *)BrotliAllocate(m,sVar36);
LAB_01f7387b:
      uVar43 = total_length * 0x10 + 0x3f0;
      uVar45 = uVar43 >> 6;
      if (uVar43 < 0x40) {
        out = (HistogramCommand *)0x0;
        local_e8 = (uint32_t *)0x0;
      }
      else {
        out = (HistogramCommand *)BrotliAllocate(m,uVar45 * 0xb10);
        local_e8 = (uint32_t *)BrotliAllocate(m,uVar45 * 4);
      }
      if (total_length == 0) {
        local_100 = (HistogramCommand *)0x0;
      }
      else {
        sVar6 = 0x40;
        if (total_length < 0x40) {
          sVar6 = total_length;
        }
        local_100 = (HistogramCommand *)BrotliAllocate(m,sVar6 * 0xb10);
      }
      local_80 = (HistogramPair *)BrotliAllocate(m,0xc018);
      tmp_00 = (HistogramCommand *)BrotliAllocate(m,0x1620);
      switchD_016d8eb1::default(puVar8,0,sVar36);
      lVar38 = 0;
      sVar6 = 0;
      while (sVar23 = sVar6 + 1, sVar23 - num_commands != 1) {
        puVar8[lVar38 + 0x100] = puVar8[lVar38 + 0x100] + 1;
        if ((sVar23 == num_commands) ||
           (pcVar2 = (char *)((long)pvVar42 + sVar6), sVar6 = sVar23,
           *pcVar2 != *(char *)((long)pvVar42 + sVar23))) {
          lVar38 = lVar38 + 1;
          sVar6 = sVar23;
        }
      }
      uVar43 = 0;
      local_c0 = local_e0;
      local_f0 = (void *)0x0;
      local_f8 = (uint32_t *)0x0;
      local_b8 = (void *)0x0;
      local_a0 = 0;
      sVar6 = total_length;
      local_a8 = uVar45;
      while( true ) {
        uVar35 = 0x40;
        if (sVar6 < 0x40) {
          uVar35 = sVar6;
        }
        uVar14 = total_length - uVar43;
        if (total_length < uVar43 || uVar14 == 0) break;
        for (uVar31 = 0; uVar31 != uVar35; uVar31 = uVar31 + 1) {
          uVar4 = puVar8[uVar43 + uVar31 + 0x100];
          pHVar12 = local_100 + uVar31;
          switchD_016d8eb1::default(pHVar12,0,0xb08);
          local_100[uVar31].bit_cost_ = INFINITY;
          lVar38 = (long)local_f0 * 2;
          local_f0 = (void *)((long)local_f0 + (ulong)uVar4);
          for (sVar23 = 1; sVar23 - uVar4 != 1; sVar23 = sVar23 + 1) {
            pHVar12->data_[*(ushort *)((long)pvVar10 + sVar23 * 2 + lVar38 + -2)] =
                 pHVar12->data_[*(ushort *)((long)pvVar10 + sVar23 * 2 + lVar38 + -2)] + 1;
            pHVar12->total_count_ = sVar23;
          }
          dVar48 = BrotliPopulationCostCommand(pHVar12);
          pHVar12->bit_cost_ = dVar48;
          puVar8[uVar31 + 0x40] = (uint32_t)uVar31;
          puVar8[uVar31 + 0x80] = (uint32_t)uVar31;
          puVar8[uVar31] = 1;
        }
        if (0x3f < uVar14) {
          uVar14 = 0x40;
        }
        sVar23 = BrotliHistogramCombineCommand
                           (local_100,tmp_00,puVar8,puVar8 + 0x80,puVar8 + 0x40,local_80,uVar14,
                            uVar14,0x40,0x800);
        uVar14 = local_a0 + sVar23;
        if (uVar45 < uVar14) {
          uVar31 = uVar45;
          if (uVar45 == 0) {
            uVar31 = uVar14;
          }
          do {
            uVar44 = uVar31;
            uVar31 = uVar44 * 2;
          } while (uVar44 < uVar14);
          pHVar12 = (HistogramCommand *)BrotliAllocate(m,uVar44 * 0xb10);
          if (uVar45 != 0) {
            switchD_016b45db::default(pHVar12,out,uVar45 * 0xb10);
          }
          BrotliFree(m,out);
          out = pHVar12;
          uVar45 = uVar44;
        }
        uVar14 = (long)local_b8 + sVar23;
        if (local_a8 < uVar14) {
          uVar31 = local_a8;
          if (local_a8 == 0) {
            uVar31 = uVar14;
          }
          do {
            uVar44 = uVar31;
            uVar31 = uVar44 * 2;
          } while (uVar44 < uVar14);
          puVar21 = (uint32_t *)BrotliAllocate(m,uVar44 * 4);
          if (local_a8 != 0) {
            switchD_016b45db::default(puVar21,local_e8,local_a8 << 2);
          }
          BrotliFree(m,local_e8);
          local_a8 = uVar44;
          local_e8 = puVar21;
        }
        pHVar12 = out + local_a0;
        for (sVar40 = 0; sVar23 != sVar40; sVar40 = sVar40 + 1) {
          switchD_016b45db::default(pHVar12,local_100 + puVar8[sVar40 + 0x40],0xb10);
          local_e8[(long)local_b8 + sVar40] = puVar8[puVar8[sVar40 + 0x40]];
          puVar8[(ulong)puVar8[sVar40 + 0x40] + 0xc0] = (uint32_t)sVar40;
          pHVar12 = pHVar12 + 1;
        }
        local_b8 = (void *)((long)local_b8 + sVar40);
        local_a0 = local_a0 + sVar40;
        for (uVar14 = 0; uVar35 != uVar14; uVar14 = uVar14 + 1) {
          local_c0[uVar14] = puVar8[(ulong)puVar8[uVar14 + 0x80] + 0xc0] + (int)local_f8;
        }
        local_f8 = (uint32_t *)((long)local_f8 + sVar23);
        uVar43 = uVar43 + 0x40;
        sVar6 = sVar6 - 0x40;
        local_c0 = local_c0 + 0x40;
      }
      BrotliFree(m,local_100);
      uVar45 = ((ulong)local_f8 >> 1) * (long)local_f8;
      if ((ulong)((long)local_f8 << 6) < uVar45) {
        uVar45 = (long)local_f8 << 6;
      }
      if (0x800 < uVar45) {
        BrotliFree(m,local_80);
        local_80 = (HistogramPair *)BrotliAllocate(m,uVar45 * 0x18 + 0x18);
      }
      if (local_f8 == (uint32_t *)0x0) {
        puVar21 = (uint32_t *)0x0;
      }
      else {
        puVar21 = (uint32_t *)BrotliAllocate(m,(long)local_f8 * 4);
      }
      for (uVar43 = 0; local_f8 != (uint32_t *)uVar43; uVar43 = uVar43 + 1) {
        puVar21[uVar43] = (uint32_t)uVar43;
      }
      sVar6 = BrotliHistogramCombineCommand
                        (out,tmp_00,local_e8,local_e0,puVar21,local_80,(size_t)local_f8,total_length
                         ,0x100,uVar45);
      BrotliFree(m,local_80);
      BrotliFree(m,local_e8);
      if (local_f8 == (uint32_t *)0x0) {
        pvVar13 = (void *)0x0;
      }
      else {
        pvVar13 = BrotliAllocate(m,(long)local_f8 * 4);
      }
      for (uVar45 = 0; local_f8 != (uint32_t *)uVar45; uVar45 = uVar45 + 1) {
        *(undefined4 *)((long)pvVar13 + uVar45 * 4) = 0xffffffff;
      }
      local_f0 = (void *)0x0;
      iVar26 = 0;
      for (sVar23 = 0; sVar23 != total_length; sVar23 = sVar23 + 1) {
        switchD_016d8eb1::default(tmp_00,0,0xb08);
        tmp_00->bit_cost_ = INFINITY;
        uVar45 = 0;
        while (uVar45 < puVar8[sVar23 + 0x100]) {
          tmp_00->data_[*(ushort *)((long)pvVar10 + uVar45 * 2 + (long)local_f0 * 2)] =
               tmp_00->data_[*(ushort *)((long)pvVar10 + uVar45 * 2 + (long)local_f0 * 2)] + 1;
          uVar45 = uVar45 + 1;
          tmp_00->total_count_ = uVar45;
        }
        lVar38 = sVar23 - 1;
        if (sVar23 == 0) {
          lVar38 = 0;
        }
        uVar43 = (ulong)local_e0[lVar38];
        local_118 = (HistogramDistance *)
                    BrotliHistogramBitCostDistanceCommand(tmp_00,out + uVar43,tmp_00 + 1);
        local_f0 = (void *)((long)local_f0 + uVar45);
        for (sVar40 = 0; sVar6 != sVar40; sVar40 = sVar40 + 1) {
          dVar48 = BrotliHistogramBitCostDistanceCommand(tmp_00,out + puVar21[sVar40],tmp_00 + 1);
          if (dVar48 < (double)local_118) {
            uVar43 = (ulong)puVar21[sVar40];
            local_118 = (HistogramDistance *)dVar48;
          }
        }
        local_e0[sVar23] = (uint32_t)uVar43;
        if (*(int *)((long)pvVar13 + uVar43 * 4) == -1) {
          *(int *)((long)pvVar13 + uVar43 * 4) = iVar26;
          iVar26 = iVar26 + 1;
        }
      }
      BrotliFree(m,tmp_00);
      BrotliFree(m,puVar21);
      BrotliFree(m,out);
      uVar45 = insert_and_copy_split->types_alloc_size;
      if (uVar45 < total_length) {
        if (uVar45 == 0) {
          uVar45 = total_length;
        }
        do {
          uVar43 = uVar45;
          uVar45 = uVar43 * 2;
        } while (uVar43 < total_length);
        puVar7 = (uint8_t *)BrotliAllocate(m,uVar43);
        if (insert_and_copy_split->types_alloc_size != 0) {
          switchD_016b45db::default
                    (puVar7,insert_and_copy_split->types,insert_and_copy_split->types_alloc_size);
        }
        BrotliFree(m,insert_and_copy_split->types);
        insert_and_copy_split->types = puVar7;
        insert_and_copy_split->types_alloc_size = uVar43;
      }
      uVar45 = insert_and_copy_split->lengths_alloc_size;
      if (uVar45 < total_length) {
        if (uVar45 == 0) {
          uVar45 = total_length;
        }
        do {
          uVar43 = uVar45;
          uVar45 = uVar43 * 2;
        } while (uVar43 < total_length);
        puVar21 = (uint32_t *)BrotliAllocate(m,uVar43 * 4);
        if (insert_and_copy_split->lengths_alloc_size != 0) {
          switchD_016b45db::default
                    (puVar21,insert_and_copy_split->lengths,
                     insert_and_copy_split->lengths_alloc_size << 2);
        }
        BrotliFree(m,insert_and_copy_split->lengths);
        insert_and_copy_split->lengths = puVar21;
        insert_and_copy_split->lengths_alloc_size = uVar43;
      }
      sVar6 = 0;
      sVar23 = 0;
      uVar45 = 0;
      do {
        uVar33 = 0;
        do {
          sVar40 = sVar6;
          uVar43 = uVar45 & 0xff;
          if (total_length == sVar40) {
            insert_and_copy_split->num_blocks = sVar23;
            insert_and_copy_split->num_types = uVar43 + 1;
            BrotliFree(m,pvVar13);
            BrotliFree(m,puVar8);
            BrotliFree(m,local_e0);
            BrotliFree(m,pvVar42);
            goto LAB_01f741b8;
          }
          uVar33 = uVar33 + puVar8[sVar40 + 0x100];
        } while ((total_length - 1 != sVar40) &&
                (sVar6 = sVar40 + 1, local_e0[sVar40] == local_e0[sVar40 + 1]));
        uVar4 = *(uint *)((long)pvVar13 + (ulong)local_e0[sVar40] * 4);
        bVar25 = (byte)uVar4;
        insert_and_copy_split->types[sVar23] = bVar25;
        bVar34 = (byte)uVar45;
        uVar45 = (ulong)uVar4;
        if (bVar25 < bVar34) {
          uVar45 = uVar43;
        }
        insert_and_copy_split->lengths[sVar23] = uVar33;
        sVar23 = sVar23 + 1;
        sVar6 = sVar40 + 1;
      } while( true );
    }
    sVar6 = insert_and_copy_split->num_blocks;
    uVar43 = insert_and_copy_split->types_alloc_size;
    uVar45 = sVar6 + 1;
    if (uVar43 < uVar45) {
      if (uVar43 == 0) {
        uVar43 = uVar45;
      }
      do {
        uVar35 = uVar43;
        uVar43 = uVar35 * 2;
      } while (uVar35 < uVar45);
      puVar7 = (uint8_t *)BrotliAllocate(m,uVar35);
      if (insert_and_copy_split->types_alloc_size != 0) {
        switchD_016b45db::default
                  (puVar7,insert_and_copy_split->types,insert_and_copy_split->types_alloc_size);
      }
      BrotliFree(m,insert_and_copy_split->types);
      insert_and_copy_split->types = puVar7;
      insert_and_copy_split->types_alloc_size = uVar35;
      sVar6 = insert_and_copy_split->num_blocks;
      uVar45 = sVar6 + 1;
    }
    uVar43 = insert_and_copy_split->lengths_alloc_size;
    if (uVar43 < uVar45) {
      if (uVar43 == 0) {
        uVar43 = uVar45;
      }
      do {
        uVar35 = uVar43;
        uVar43 = uVar35 * 2;
      } while (uVar35 < uVar45);
      puVar8 = (uint32_t *)BrotliAllocate(m,uVar35 * 4);
      if (insert_and_copy_split->lengths_alloc_size != 0) {
        switchD_016b45db::default
                  (puVar8,insert_and_copy_split->lengths,
                   insert_and_copy_split->lengths_alloc_size << 2);
      }
      BrotliFree(m,insert_and_copy_split->lengths);
      insert_and_copy_split->lengths = puVar8;
      insert_and_copy_split->lengths_alloc_size = uVar35;
      sVar6 = insert_and_copy_split->num_blocks;
    }
    insert_and_copy_split->num_types = 1;
    insert_and_copy_split->types[sVar6] = '\0';
    sVar6 = insert_and_copy_split->num_blocks;
    insert_and_copy_split->lengths[sVar6] = (uint32_t)num_commands;
    insert_and_copy_split->num_blocks = sVar6 + 1;
  }
LAB_01f741b8:
  BrotliFree(m,pvVar10);
  if (num_commands == 0) {
    pvVar10 = (void *)0x0;
  }
  else {
    pvVar10 = BrotliAllocate(m,num_commands * 2);
  }
  puVar11 = &cmds->dist_prefix_;
  total_length = 0;
  while (bVar47 = num_commands != 0, num_commands = num_commands - 1, bVar47) {
    if (((*(uint *)(puVar11 + -5) & 0x1ffffff) != 0) && (0x7f < puVar11[-1])) {
      *(uint16_t *)((long)pvVar10 + total_length * 2) = *puVar11 & 0x3ff;
      total_length = total_length + 1;
    }
    puVar11 = puVar11 + 8;
  }
  uVar45 = (ulong)(ushort)((ushort)total_length / 0x220 + 1);
  if (0x6a3f < total_length) {
    uVar45 = 0x32;
  }
  if (total_length == 0) {
    dist_split->num_types = 1;
LAB_01f753b6:
    BrotliFree(m,pvVar10);
    return;
  }
  if (total_length < 0x80) {
    sVar6 = dist_split->num_blocks;
    uVar43 = dist_split->types_alloc_size;
    uVar45 = sVar6 + 1;
    if (uVar43 < uVar45) {
      if (uVar43 == 0) {
        uVar43 = uVar45;
      }
      do {
        uVar35 = uVar43;
        uVar43 = uVar35 * 2;
      } while (uVar35 < uVar45);
      puVar7 = (uint8_t *)BrotliAllocate(m,uVar35);
      if (dist_split->types_alloc_size != 0) {
        switchD_016b45db::default(puVar7,dist_split->types,dist_split->types_alloc_size);
      }
      BrotliFree(m,dist_split->types);
      dist_split->types = puVar7;
      dist_split->types_alloc_size = uVar35;
      sVar6 = dist_split->num_blocks;
      uVar45 = sVar6 + 1;
    }
    uVar43 = dist_split->lengths_alloc_size;
    if (uVar43 < uVar45) {
      if (uVar43 == 0) {
        uVar43 = uVar45;
      }
      do {
        uVar35 = uVar43;
        uVar43 = uVar35 * 2;
      } while (uVar35 < uVar45);
      puVar8 = (uint32_t *)BrotliAllocate(m,uVar35 * 4);
      if (dist_split->lengths_alloc_size != 0) {
        switchD_016b45db::default(puVar8,dist_split->lengths,dist_split->lengths_alloc_size << 2);
      }
      BrotliFree(m,dist_split->lengths);
      dist_split->lengths = puVar8;
      dist_split->lengths_alloc_size = uVar35;
      sVar6 = dist_split->num_blocks;
    }
    dist_split->num_types = 1;
    dist_split->types[sVar6] = '\0';
    sVar6 = dist_split->num_blocks;
    dist_split->lengths[sVar6] = (uint32_t)total_length;
    dist_split->num_blocks = sVar6 + 1;
    goto LAB_01f753b6;
  }
  lVar41 = uVar45 * 0x890;
  pvVar13 = BrotliAllocate(m,lVar41 + 0x890);
  for (lVar38 = 0; lVar41 - lVar38 != 0; lVar38 = lVar38 + 0x890) {
    switchD_016d8eb1::default((void *)(lVar38 + (long)pvVar13),0,0x888);
    *(undefined8 *)((long)pvVar13 + lVar38 + 0x888) = 0x7ff0000000000000;
  }
  uVar43 = 7;
  for (uVar35 = 0; uVar35 != uVar45; uVar35 = uVar35 + 1) {
    uVar14 = (uVar35 * total_length) / uVar45;
    if (uVar35 != 0) {
      uVar43 = (ulong)(uint)((int)uVar43 * 0x41a7);
      uVar14 = uVar14 + uVar43 % (total_length / uVar45);
    }
    if (total_length <= uVar14 + 0x28) {
      uVar14 = total_length - 0x29;
    }
    plVar3 = (long *)((long)pvVar13 + uVar35 * 0x890 + 0x880);
    *plVar3 = *plVar3 + 0x28;
    for (lVar38 = 0; lVar38 != 0x28; lVar38 = lVar38 + 1) {
      piVar1 = (int *)((long)pvVar13 +
                      (ulong)*(ushort *)((long)pvVar10 + lVar38 * 2 + uVar14 * 2) * 4 +
                      uVar35 * 0x890);
      *piVar1 = *piVar1 + 1;
    }
  }
  pvVar42 = (void *)(lVar41 + (long)pvVar13);
  uVar35 = (total_length * 2) / 0x28 + uVar45 + 99;
  uVar43 = 7;
  for (uVar14 = 0; uVar14 < uVar35 - uVar35 % uVar45; uVar14 = uVar14 + 1) {
    switchD_016d8eb1::default(pvVar42,0,0x880);
    *(undefined8 *)((long)pvVar42 + 0x888) = 0x7ff0000000000000;
    uVar43 = (ulong)(uint)((int)uVar43 * 0x41a7);
    puVar15 = (ushort *)((long)pvVar10 + (uVar43 % (total_length - 0x27)) * 2);
    *(undefined8 *)((long)pvVar42 + 0x880) = 0x28;
    for (lVar38 = -0x28; lVar38 != 0; lVar38 = lVar38 + 1) {
      uVar5 = *puVar15;
      puVar15 = puVar15 + 1;
      piVar1 = (int *)((long)pvVar42 + (ulong)uVar5 * 4);
      *piVar1 = *piVar1 + 1;
    }
    lVar38 = (uVar14 % uVar45) * 0x890;
    plVar3 = (long *)((long)pvVar13 + lVar38 + 0x880);
    *plVar3 = *plVar3 + 0x28;
    for (lVar41 = 0; lVar41 != 0x220; lVar41 = lVar41 + 1) {
      piVar1 = (int *)((long)pvVar13 + lVar41 * 4 + lVar38);
      *piVar1 = *piVar1 + *(int *)((long)pvVar42 + lVar41 * 4);
    }
  }
  pvVar42 = BrotliAllocate(m,total_length);
  iVar26 = (int)uVar45;
  pdVar16 = (double *)BrotliAllocate(m,uVar45 * 0x1100);
  pvVar17 = BrotliAllocate(m,(ulong)(uint)(iVar26 * 8));
  sVar6 = (iVar26 + 7U >> 3) * total_length;
  if (sVar6 == 0) {
    local_b8 = (void *)0x0;
  }
  else {
    local_b8 = BrotliAllocate(m,sVar6);
  }
  pvVar18 = BrotliAllocate(m,(ulong)(uint)(iVar26 * 2));
  if (10 < params->quality) {
    local_58 = 10;
  }
  uVar43 = 0;
  for (lVar38 = 0; lVar38 != local_58; lVar38 = lVar38 + 1) {
    if (uVar45 < 2) {
      for (sVar6 = 0; total_length != sVar6; sVar6 = sVar6 + 1) {
        *(undefined1 *)((long)pvVar42 + sVar6) = 0;
      }
      uVar43 = 1;
    }
    else {
      uVar35 = uVar45 + 7 >> 3;
      switchD_016d8eb1::default(pdVar16,0,uVar45 * 0x1100);
      puVar28 = (uint *)((long)pvVar13 + 0x880);
      for (uVar43 = 0; uVar45 != uVar43; uVar43 = uVar43 + 1) {
        uVar14 = (ulong)*puVar28;
        if (uVar14 < 0x100) {
          dVar48 = *(double *)(kBrotliLog2Table + uVar14 * 8);
        }
        else {
          dVar48 = log2((double)uVar14);
        }
        pdVar16[uVar43] = dVar48;
        puVar28 = puVar28 + 0x224;
      }
      lVar46 = uVar45 * 0x10f8;
      local_110 = (HistogramDistance *)0x220;
      lVar41 = (long)pvVar13 + 0x87c;
      while (bVar47 = local_110 != (HistogramDistance *)0x0,
            local_110 = (HistogramDistance *)((long)local_110 + -1), bVar47) {
        pdVar29 = pdVar16;
        for (lVar37 = 0; uVar45 * 0x112 - lVar37 != 0; lVar37 = lVar37 + 0x112) {
          dVar48 = *pdVar29;
          uVar4 = *(uint *)(lVar41 + lVar37 * 8);
          uVar43 = (ulong)uVar4;
          dVar49 = -2.0;
          if (uVar43 != 0) {
            if (uVar4 < 0x100) {
              dVar49 = *(double *)(kBrotliLog2Table + uVar43 * 8);
            }
            else {
              dVar49 = log2((double)uVar43);
            }
          }
          *(double *)((long)pdVar29 + lVar46) = dVar48 - dVar49;
          pdVar29 = pdVar29 + 1;
        }
        lVar46 = lVar46 + uVar45 * -8;
        lVar41 = lVar41 + -4;
      }
      switchD_016d8eb1::default(pvVar17,0,uVar45 * 8);
      switchD_016d8eb1::default(local_b8,0,uVar35 * total_length);
      for (uVar43 = 0; uVar43 != total_length; uVar43 = uVar43 + 1) {
        uVar5 = *(ushort *)((long)pvVar10 + uVar43 * 2);
        dVar48 = 1e+99;
        for (uVar14 = 0; uVar45 != uVar14; uVar14 = uVar14 + 1) {
          dVar49 = pdVar16[uVar5 * uVar45 + uVar14] + *(double *)((long)pvVar17 + uVar14 * 8);
          *(double *)((long)pvVar17 + uVar14 * 8) = dVar49;
          if (dVar49 < dVar48) {
            *(char *)((long)pvVar42 + uVar43) = (char)uVar14;
            dVar48 = dVar49;
          }
        }
        dVar49 = 14.6;
        if (uVar43 < 2000) {
          dVar49 = (((double)(long)uVar43 * 0.07) / 2000.0 + 0.77) * 14.6;
        }
        for (uVar14 = 0; uVar45 != uVar14; uVar14 = uVar14 + 1) {
          dVar50 = *(double *)((long)pvVar17 + uVar14 * 8) - dVar48;
          *(double *)((long)pvVar17 + uVar14 * 8) = dVar50;
          if (dVar49 <= dVar50) {
            *(double *)((long)pvVar17 + uVar14 * 8) = dVar49;
            pbVar27 = (byte *)((long)local_b8 + (uVar14 >> 3) + uVar43 * uVar35);
            *pbVar27 = *pbVar27 | '\x01' << ((byte)uVar14 & 7);
          }
        }
      }
      bVar25 = *(byte *)((long)pvVar42 + (total_length - 1));
      pvVar19 = (void *)((total_length - 2) * uVar35 + (long)local_b8);
      uVar43 = 1;
      for (sVar6 = total_length; sVar6 != 1; sVar6 = sVar6 - 1) {
        if ((*(byte *)((long)pvVar19 + (ulong)(bVar25 >> 3)) >> (bVar25 & 7) & 1) != 0) {
          bVar34 = *(byte *)((long)pvVar42 + (sVar6 - 2));
          uVar43 = uVar43 + (bVar25 != bVar34);
          bVar25 = bVar34;
        }
        *(byte *)((long)pvVar42 + (sVar6 - 2)) = bVar25;
        pvVar19 = (void *)((long)pvVar19 - uVar35);
      }
    }
    for (uVar35 = 0; uVar45 != uVar35; uVar35 = uVar35 + 1) {
      *(undefined2 *)((long)pvVar18 + uVar35 * 2) = 0x100;
    }
    uVar5 = 0;
    for (sVar6 = 0; total_length != sVar6; sVar6 = sVar6 + 1) {
      if (*(short *)((long)pvVar18 + (ulong)*(byte *)((long)pvVar42 + sVar6) * 2) == 0x100) {
        *(ushort *)((long)pvVar18 + (ulong)*(byte *)((long)pvVar42 + sVar6) * 2) = uVar5;
        uVar5 = uVar5 + 1;
      }
    }
    for (sVar6 = 0; total_length != sVar6; sVar6 = sVar6 + 1) {
      *(undefined1 *)((long)pvVar42 + sVar6) =
           *(undefined1 *)((long)pvVar18 + (ulong)*(byte *)((long)pvVar42 + sVar6) * 2);
    }
    uVar45 = (ulong)uVar5;
    for (lVar41 = 0; uVar45 * 0x890 - lVar41 != 0; lVar41 = lVar41 + 0x890) {
      switchD_016d8eb1::default((void *)(lVar41 + (long)pvVar13),0,0x888);
      *(undefined8 *)((long)pvVar13 + lVar41 + 0x888) = 0x7ff0000000000000;
    }
    for (sVar6 = 0; total_length != sVar6; sVar6 = sVar6 + 1) {
      lVar41 = (ulong)*(byte *)((long)pvVar42 + sVar6) * 0x890;
      piVar1 = (int *)((long)pvVar13 + (ulong)*(ushort *)((long)pvVar10 + sVar6 * 2) * 4 + lVar41);
      *piVar1 = *piVar1 + 1;
      plVar3 = (long *)((long)pvVar13 + lVar41 + 0x880);
      *plVar3 = *plVar3 + 1;
    }
  }
  BrotliFree(m,pdVar16);
  BrotliFree(m,pvVar17);
  BrotliFree(m,local_b8);
  BrotliFree(m,pvVar18);
  BrotliFree(m,pvVar13);
  if (uVar43 == 0) {
    lVar38 = 0x100;
    local_e0 = (uint32_t *)0x0;
  }
  else {
    local_e0 = (uint32_t *)BrotliAllocate(m,uVar43 * 4);
    lVar38 = uVar43 + 0x100;
    if (lVar38 == 0) {
      sVar36 = 0;
      puVar8 = (uint32_t *)0x0;
      goto LAB_01f74a88;
    }
  }
  sVar36 = lVar38 << 2;
  puVar8 = (uint32_t *)BrotliAllocate(m,sVar36);
LAB_01f74a88:
  uVar35 = uVar43 * 0x10 + 0x3f0;
  uVar45 = uVar35 >> 6;
  if (uVar35 < 0x40) {
    local_110 = (HistogramDistance *)0x0;
    local_c0 = (uint32_t *)0x0;
  }
  else {
    local_110 = (HistogramDistance *)BrotliAllocate(m,uVar45 * 0x890);
    local_c0 = (uint32_t *)BrotliAllocate(m,uVar45 * 4);
  }
  if (uVar43 == 0) {
    local_118 = (HistogramDistance *)0x0;
  }
  else {
    uVar35 = 0x40;
    if (uVar43 < 0x40) {
      uVar35 = uVar43;
    }
    local_118 = (HistogramDistance *)BrotliAllocate(m,uVar35 * 0x890);
  }
  local_b0 = (HistogramPair *)BrotliAllocate(m,0xc018);
  tmp_01 = (HistogramDistance *)BrotliAllocate(m,0x1120);
  switchD_016d8eb1::default(puVar8,0,sVar36);
  lVar38 = 0;
  sVar6 = 0;
  while (sVar23 = sVar6 + 1, sVar23 - total_length != 1) {
    puVar8[lVar38 + 0x100] = puVar8[lVar38 + 0x100] + 1;
    if ((sVar23 == total_length) ||
       (pcVar2 = (char *)((long)pvVar42 + sVar6), sVar6 = sVar23,
       *pcVar2 != *(char *)((long)pvVar42 + sVar23))) {
      lVar38 = lVar38 + 1;
      sVar6 = sVar23;
    }
  }
  uVar14 = 0;
  local_f8 = local_e0;
  local_100 = (HistogramCommand *)0x0;
  total_length = 0;
  local_a0 = 0;
  local_c8 = (void *)0x0;
  uVar35 = uVar43;
  local_60 = uVar45;
  while( true ) {
    uVar31 = 0x40;
    if (uVar35 < 0x40) {
      uVar31 = uVar35;
    }
    uVar44 = uVar43 - uVar14;
    if (uVar43 < uVar14 || uVar44 == 0) break;
    for (uVar32 = 0; uVar32 != uVar31; uVar32 = uVar32 + 1) {
      uVar4 = puVar8[uVar14 + uVar32 + 0x100];
      pHVar20 = local_118 + uVar32;
      switchD_016d8eb1::default(pHVar20,0,0x888);
      local_118[uVar32].bit_cost_ = INFINITY;
      lVar38 = (long)local_100 * 2;
      local_100 = (HistogramCommand *)((long)local_100 + (ulong)uVar4);
      for (sVar6 = 1; sVar6 - uVar4 != 1; sVar6 = sVar6 + 1) {
        pHVar20->data_[*(ushort *)((long)pvVar10 + sVar6 * 2 + lVar38 + -2)] =
             pHVar20->data_[*(ushort *)((long)pvVar10 + sVar6 * 2 + lVar38 + -2)] + 1;
        pHVar20->total_count_ = sVar6;
      }
      dVar48 = BrotliPopulationCostDistance(pHVar20);
      pHVar20->bit_cost_ = dVar48;
      puVar8[uVar32 + 0x40] = (uint32_t)uVar32;
      puVar8[uVar32 + 0x80] = (uint32_t)uVar32;
      puVar8[uVar32] = 1;
    }
    if (0x3f < uVar44) {
      uVar44 = 0x40;
    }
    sVar6 = BrotliHistogramCombineDistance
                      (local_118,tmp_01,puVar8,puVar8 + 0x80,puVar8 + 0x40,local_b0,uVar44,uVar44,
                       0x40,0x800);
    uVar44 = (long)local_c8 + sVar6;
    if (uVar45 < uVar44) {
      uVar32 = uVar45;
      if (uVar45 == 0) {
        uVar32 = uVar44;
      }
      do {
        uVar24 = uVar32;
        uVar32 = uVar24 * 2;
      } while (uVar24 < uVar44);
      pHVar20 = (HistogramDistance *)BrotliAllocate(m,uVar24 * 0x890);
      if (uVar45 != 0) {
        switchD_016b45db::default(pHVar20,local_110,uVar45 * 0x890);
      }
      BrotliFree(m,local_110);
      local_110 = pHVar20;
      uVar45 = uVar24;
    }
    uVar44 = local_a0 + sVar6;
    if (local_60 < uVar44) {
      uVar32 = local_60;
      if (local_60 == 0) {
        uVar32 = uVar44;
      }
      do {
        uVar24 = uVar32;
        uVar32 = uVar24 * 2;
      } while (uVar24 < uVar44);
      puVar21 = (uint32_t *)BrotliAllocate(m,uVar24 * 4);
      if (local_60 != 0) {
        switchD_016b45db::default(puVar21,local_c0,local_60 << 2);
      }
      BrotliFree(m,local_c0);
      local_60 = uVar24;
      local_c0 = puVar21;
    }
    pHVar20 = local_110 + (long)local_c8;
    for (sVar23 = 0; sVar6 != sVar23; sVar23 = sVar23 + 1) {
      switchD_016b45db::default(pHVar20,local_118 + puVar8[sVar23 + 0x40],0x890);
      local_c0[local_a0 + sVar23] = puVar8[puVar8[sVar23 + 0x40]];
      puVar8[(ulong)puVar8[sVar23 + 0x40] + 0xc0] = (uint32_t)sVar23;
      pHVar20 = pHVar20 + 1;
    }
    local_a0 = local_a0 + sVar23;
    local_c8 = (void *)((long)local_c8 + sVar23);
    for (uVar44 = 0; uVar31 != uVar44; uVar44 = uVar44 + 1) {
      local_f8[uVar44] = puVar8[(ulong)puVar8[uVar44 + 0x80] + 0xc0] + (int)total_length;
    }
    total_length = total_length + sVar6;
    uVar14 = uVar14 + 0x40;
    uVar35 = uVar35 - 0x40;
    local_f8 = local_f8 + 0x40;
  }
  BrotliFree(m,local_118);
  uVar45 = (total_length >> 1) * total_length;
  if (total_length << 6 < uVar45) {
    uVar45 = total_length << 6;
  }
  if (0x800 < uVar45) {
    BrotliFree(m,local_b0);
    local_b0 = (HistogramPair *)BrotliAllocate(m,uVar45 * 0x18 + 0x18);
  }
  if (total_length == 0) {
    puVar21 = (uint32_t *)0x0;
  }
  else {
    puVar21 = (uint32_t *)BrotliAllocate(m,total_length * 4);
  }
  for (sVar6 = 0; total_length != sVar6; sVar6 = sVar6 + 1) {
    puVar21[sVar6] = (uint32_t)sVar6;
  }
  sVar6 = BrotliHistogramCombineDistance
                    (local_110,tmp_01,local_c0,local_e0,puVar21,local_b0,total_length,uVar43,0x100,
                     uVar45);
  BrotliFree(m,local_b0);
  BrotliFree(m,local_c0);
  if (total_length == 0) {
    pvVar13 = (void *)0x0;
  }
  else {
    pvVar13 = BrotliAllocate(m,total_length * 4);
  }
  for (sVar23 = 0; total_length != sVar23; sVar23 = sVar23 + 1) {
    *(undefined4 *)((long)pvVar13 + sVar23 * 4) = 0xffffffff;
  }
  local_f0 = (void *)0x0;
  total_length = 0;
  for (uVar45 = 0; uVar45 != uVar43; uVar45 = uVar45 + 1) {
    switchD_016d8eb1::default(tmp_01,0,0x888);
    tmp_01->bit_cost_ = INFINITY;
    uVar35 = 0;
    while (uVar35 < puVar8[uVar45 + 0x100]) {
      tmp_01->data_[*(ushort *)((long)pvVar10 + uVar35 * 2 + (long)local_f0 * 2)] =
           tmp_01->data_[*(ushort *)((long)pvVar10 + uVar35 * 2 + (long)local_f0 * 2)] + 1;
      uVar35 = uVar35 + 1;
      tmp_01->total_count_ = uVar35;
    }
    lVar38 = uVar45 - 1;
    if (uVar45 == 0) {
      lVar38 = 0;
    }
    uVar14 = (ulong)local_e0[lVar38];
    local_118 = (HistogramDistance *)
                BrotliHistogramBitCostDistanceDistance(tmp_01,local_110 + uVar14,tmp_01 + 1);
    local_f0 = (void *)((long)local_f0 + uVar35);
    for (sVar23 = 0; sVar6 != sVar23; sVar23 = sVar23 + 1) {
      dVar48 = BrotliHistogramBitCostDistanceDistance(tmp_01,local_110 + puVar21[sVar23],tmp_01 + 1)
      ;
      if (dVar48 < (double)local_118) {
        uVar14 = (ulong)puVar21[sVar23];
        local_118 = (HistogramDistance *)dVar48;
      }
    }
    local_e0[uVar45] = (uint32_t)uVar14;
    if (*(int *)((long)pvVar13 + uVar14 * 4) == -1) {
      *(int *)((long)pvVar13 + uVar14 * 4) = (int)total_length;
      total_length = (size_t)((int)total_length + 1);
    }
  }
  BrotliFree(m,tmp_01);
  BrotliFree(m,puVar21);
  BrotliFree(m,local_110);
  uVar45 = dist_split->types_alloc_size;
  if (uVar45 < uVar43) {
    if (uVar45 == 0) {
      uVar45 = uVar43;
    }
    do {
      uVar35 = uVar45;
      uVar45 = uVar35 * 2;
    } while (uVar35 < uVar43);
    puVar7 = (uint8_t *)BrotliAllocate(m,uVar35);
    if (dist_split->types_alloc_size != 0) {
      switchD_016b45db::default(puVar7,dist_split->types,dist_split->types_alloc_size);
    }
    BrotliFree(m,dist_split->types);
    dist_split->types = puVar7;
    dist_split->types_alloc_size = uVar35;
  }
  uVar45 = dist_split->lengths_alloc_size;
  if (uVar45 < uVar43) {
    if (uVar45 == 0) {
      uVar45 = uVar43;
    }
    do {
      uVar35 = uVar45;
      uVar45 = uVar35 * 2;
    } while (uVar35 < uVar43);
    puVar21 = (uint32_t *)BrotliAllocate(m,uVar35 * 4);
    if (dist_split->lengths_alloc_size != 0) {
      switchD_016b45db::default(puVar21,dist_split->lengths,dist_split->lengths_alloc_size << 2);
    }
    BrotliFree(m,dist_split->lengths);
    dist_split->lengths = puVar21;
    dist_split->lengths_alloc_size = uVar35;
  }
  uVar35 = 0;
  sVar6 = 0;
  uVar45 = 0;
  do {
    uVar33 = 0;
    do {
      uVar31 = uVar35;
      uVar14 = uVar45 & 0xff;
      if (uVar43 == uVar31) {
        dist_split->num_blocks = sVar6;
        dist_split->num_types = uVar14 + 1;
        BrotliFree(m,pvVar13);
        BrotliFree(m,puVar8);
        BrotliFree(m,local_e0);
        BrotliFree(m,pvVar42);
        goto LAB_01f753b6;
      }
      uVar33 = uVar33 + puVar8[uVar31 + 0x100];
    } while ((uVar43 - 1 != uVar31) &&
            (uVar35 = uVar31 + 1, local_e0[uVar31] == local_e0[uVar31 + 1]));
    uVar4 = *(uint *)((long)pvVar13 + (ulong)local_e0[uVar31] * 4);
    bVar25 = (byte)uVar4;
    dist_split->types[sVar6] = bVar25;
    bVar34 = (byte)uVar45;
    uVar45 = (ulong)uVar4;
    if (bVar25 < bVar34) {
      uVar45 = uVar14;
    }
    dist_split->lengths[sVar6] = uVar33;
    sVar6 = sVar6 + 1;
    uVar35 = uVar31 + 1;
  } while( true );
}

Assistant:

void duckdb_brotli::BrotliSplitBlock(MemoryManager* m,
                      const Command* cmds,
                      const size_t num_commands,
                      const uint8_t* data,
                      const size_t pos,
                      const size_t mask,
                      const BrotliEncoderParams* params,
                      BlockSplit* literal_split,
                      BlockSplit* insert_and_copy_split,
                      BlockSplit* dist_split) {
  {
    size_t literals_count = CountLiterals(cmds, num_commands);
    uint8_t* literals = BROTLI_ALLOC(m, uint8_t, literals_count);
    if (BROTLI_IS_OOM(m) || BROTLI_IS_NULL(literals)) return;
    /* Create a continuous array of literals. */
    CopyLiteralsToByteArray(cmds, num_commands, data, pos, mask, literals);
    /* Create the block split on the array of literals.
     * Literal histograms can have alphabet size up to 256.
     * Though, to accomodate context modeling, less than half of maximum size
     * is allowed. */
    SplitByteVectorLiteral(
        m, literals, literals_count,
        kSymbolsPerLiteralHistogram, kMaxLiteralHistograms,
        kLiteralStrideLength, kLiteralBlockSwitchCost, params,
        literal_split);
    if (BROTLI_IS_OOM(m)) return;
    BROTLI_FREE(m, literals);
    /* NB: this might be a good place for injecting extra splitting without
     *     increasing encoder complexity; however, output parition would be less
     *     optimal than one produced with forced splitting inside
     *     SplitByteVector (FindBlocks / ClusterBlocks). */
  }

  {
    /* Compute prefix codes for commands. */
    uint16_t* insert_and_copy_codes = BROTLI_ALLOC(m, uint16_t, num_commands);
    size_t i;
    if (BROTLI_IS_OOM(m) || BROTLI_IS_NULL(insert_and_copy_codes)) return;
    for (i = 0; i < num_commands; ++i) {
      insert_and_copy_codes[i] = cmds[i].cmd_prefix_;
    }
    /* Create the block split on the array of command prefixes. */
    SplitByteVectorCommand(
        m, insert_and_copy_codes, num_commands,
        kSymbolsPerCommandHistogram, kMaxCommandHistograms,
        kCommandStrideLength, kCommandBlockSwitchCost, params,
        insert_and_copy_split);
    if (BROTLI_IS_OOM(m)) return;
    /* TODO(eustas): reuse for distances? */
    BROTLI_FREE(m, insert_and_copy_codes);
  }

  {
    /* Create a continuous array of distance prefixes. */
    uint16_t* distance_prefixes = BROTLI_ALLOC(m, uint16_t, num_commands);
    size_t j = 0;
    size_t i;
    if (BROTLI_IS_OOM(m) || BROTLI_IS_NULL(distance_prefixes)) return;
    for (i = 0; i < num_commands; ++i) {
      const Command* cmd = &cmds[i];
      if (CommandCopyLen(cmd) && cmd->cmd_prefix_ >= 128) {
        distance_prefixes[j++] = cmd->dist_prefix_ & 0x3FF;
      }
    }
    /* Create the block split on the array of distance prefixes. */
    SplitByteVectorDistance(
        m, distance_prefixes, j,
        kSymbolsPerDistanceHistogram, kMaxCommandHistograms,
        kDistanceStrideLength, kDistanceBlockSwitchCost, params,
        dist_split);
    if (BROTLI_IS_OOM(m)) return;
    BROTLI_FREE(m, distance_prefixes);
  }
}